

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_init(Curl_easy *data)

{
  FILEPROTO *pFVar1;
  SMTP *smtp;
  CURLcode result;
  Curl_easy *data_local;
  
  smtp._4_4_ = CURLE_OK;
  pFVar1 = (FILEPROTO *)(*Curl_ccalloc)(1,0x30);
  (data->req).p.file = pFVar1;
  if (pFVar1 == (FILEPROTO *)0x0) {
    smtp._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return smtp._4_4_;
}

Assistant:

static CURLcode smtp_init(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct SMTP *smtp;

  smtp = data->req.p.smtp = calloc(1, sizeof(struct SMTP));
  if(!smtp)
    result = CURLE_OUT_OF_MEMORY;

  return result;
}